

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,double&,std::__cxx11::string>
          (pybind11 *this,double *args_,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args__1)

{
  undefined8 uVar1;
  cast_error *this_00;
  long *plVar2;
  long lVar3;
  long lStack_b8;
  array<pybind11::object,_2UL> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  
  plVar2 = &lStack_b8;
  args._M_elems[0].super_handle.m_ptr = (handle)PyFloat_FromDouble(*args_);
  args._M_elems[1].super_handle =
       detail::
       string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ::cast(args__1,automatic_reference,(handle)0x0);
  lVar3 = 0;
  while( true ) {
    plVar2 = plVar2 + 1;
    if (lVar3 == -0x40) {
      tuple::tuple((tuple *)this,2);
      lVar3 = 0;
      while( true ) {
        if (lVar3 == 0x10) {
          std::array<pybind11::object,_2UL>::~array(&args);
          return (object)(object)this;
        }
        uVar1 = *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3);
        *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3) = 0;
        if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) break;
        *(undefined8 *)(*(long *)this + 0x18 + lVar3) = uVar1;
        lVar3 = lVar3 + 8;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/cast.h"
                    ,0x6ee,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <double &, std::basic_string<char>>]"
                   );
    }
    if (*plVar2 == 0) break;
    lVar3 = lVar3 + -0x20;
  }
  type_id<double&>();
  type_id<std::__cxx11::string>();
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_a0,"make_tuple(): unable to convert argument of type \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&argtypes - lVar3));
  std::operator+(&local_80,&local_a0,"\' to Python object");
  cast_error::runtime_error(this_00,&local_80);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}